

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::initOpen(CDirectiveFile *this,path *fileName,int64_t memory)

{
  FileManager *this_00;
  shared_ptr<AssemblerFile> local_78 [2];
  undefined1 local_51;
  undefined1 local_50 [24];
  path fullName;
  int64_t memory_local;
  path *fileName_local;
  CDirectiveFile *this_local;
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 1;
  fullName._path.field_2._8_8_ = memory;
  getFullPathName((path *)(local_50 + 0x10),fileName);
  local_51 = 0;
  std::make_shared<GenericAssemblerFile,ghc::filesystem::path&,long&,bool>
            ((path *)local_50,(long *)(local_50 + 0x10),
             (bool *)(fullName._path.field_2._M_local_buf + 8));
  std::shared_ptr<GenericAssemblerFile>::operator=
            (&this->file,(shared_ptr<GenericAssemblerFile> *)local_50);
  std::shared_ptr<GenericAssemblerFile>::~shared_ptr((shared_ptr<GenericAssemblerFile> *)local_50);
  this_00 = g_fileManager;
  std::shared_ptr<AssemblerFile>::shared_ptr<GenericAssemblerFile,void>(local_78,&this->file);
  FileManager::addFile(this_00,local_78);
  std::shared_ptr<AssemblerFile>::~shared_ptr(local_78);
  Global.Section = Global.Section + 1;
  CAssemblerCommand::updateSection(&this->super_CAssemblerCommand,Global.Section);
  ghc::filesystem::path::~path((path *)(local_50 + 0x10));
  return;
}

Assistant:

void CDirectiveFile::initOpen(const fs::path& fileName, int64_t memory)
{
	type = Type::Open;
	fs::path fullName = getFullPathName(fileName);

	file = std::make_shared<GenericAssemblerFile>(fullName,memory,false);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}